

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::MinMaxState<unsigned_short>,unsigned_short,duckdb::MaxOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ushort uVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t iVar11;
  byte bVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar10 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
LAB_00ecdd16:
          uVar8 = uVar10;
          if (uVar10 < uVar7) {
            bVar12 = state[2];
            do {
              uVar1 = *(ushort *)(pdVar3 + uVar10 * 2);
              if ((bVar12 & 1) == 0) {
                *(ushort *)state = uVar1;
                state[2] = '\x01';
                bVar12 = 1;
              }
              else if (*(ushort *)state < uVar1) {
                *(ushort *)state = uVar1;
              }
              uVar10 = uVar10 + 1;
              uVar8 = uVar7;
            } while (uVar7 != uVar10);
          }
        }
        else {
          uVar4 = puVar2[uVar6];
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_00ecdd16;
          uVar8 = uVar7;
          if ((uVar4 != 0) && (uVar8 = uVar10, uVar10 < uVar7)) {
            uVar13 = 0;
            do {
              if ((uVar4 >> (uVar13 & 0x3f) & 1) != 0) {
                uVar1 = *(ushort *)(pdVar3 + uVar13 * 2 + uVar10 * 2);
                if (state[2] == '\0') {
                  *(ushort *)state = uVar1;
                  state[2] = '\x01';
                }
                else if (*(ushort *)state < uVar1) {
                  *(ushort *)state = uVar1;
                }
              }
              uVar13 = uVar13 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar13);
          }
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      uVar1 = *(ushort *)input->data;
      if (state[2] == '\0') {
        *(ushort *)state = uVar1;
        state[2] = '\x01';
      }
      else if (*(ushort *)state < uVar1) {
        *(ushort *)state = uVar1;
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_68.sel)->sel_vector;
        bVar12 = state[2];
        iVar9 = 0;
        do {
          iVar11 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar5[iVar9];
          }
          uVar1 = *(ushort *)(local_68.data + iVar11 * 2);
          if ((bVar12 & 1) == 0) {
            *(ushort *)state = uVar1;
            state[2] = '\x01';
            bVar12 = 1;
          }
          else if (*(ushort *)state < uVar1) {
            *(ushort *)state = uVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar11 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar5[iVar9];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          uVar1 = *(ushort *)(local_68.data + iVar11 * 2);
          if (state[2] == '\0') {
            *(ushort *)state = uVar1;
            state[2] = '\x01';
          }
          else if (*(ushort *)state < uVar1) {
            *(ushort *)state = uVar1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}